

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_sub_8_er_di(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(m68ki_cpu.ir >> 7 & 0x1c);
  uVar2 = OPER_AY_DI_8();
  uVar1 = *(uint *)((long)m68ki_cpu.dar + uVar4);
  uVar3 = uVar1 & 0xff;
  m68ki_cpu.x_flag = uVar3 - uVar2;
  m68ki_cpu.v_flag = (uVar3 ^ m68ki_cpu.x_flag) & (uVar2 ^ uVar3);
  m68ki_cpu.not_z_flag = m68ki_cpu.x_flag & 0xff;
  m68ki_cpu.n_flag = m68ki_cpu.x_flag;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  *(uint *)((long)m68ki_cpu.dar + uVar4) = uVar1 & 0xffffff00 | m68ki_cpu.not_z_flag;
  return;
}

Assistant:

static void m68k_op_sub_8_er_di(void)
{
	uint* r_dst = &DX;
	uint src = OPER_AY_DI_8();
	uint dst = MASK_OUT_ABOVE_8(*r_dst);
	uint res = dst - src;

	FLAG_N = NFLAG_8(res);
	FLAG_X = FLAG_C = CFLAG_8(res);
	FLAG_V = VFLAG_SUB_8(src, dst, res);
	FLAG_Z = MASK_OUT_ABOVE_8(res);

	*r_dst = MASK_OUT_BELOW_8(*r_dst) | FLAG_Z;
}